

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::edge_with_same_filtration
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,Simplex_handle *sh)

{
  type_conflict3 tVar1;
  bool bVar2;
  Filtration_value *pFVar3;
  pointer ppVar4;
  Siblings *pSVar5;
  reference piVar6;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  *lhs;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  *in_RDX;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  SVar7;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_1e8;
  int local_1dc;
  undefined1 local_1d8 [4];
  int w;
  iterator __end0;
  iterator __begin0;
  Static_vertex_vector *__range3;
  undefined8 local_1b8;
  Dictionary *children1;
  Vertex_handle v;
  undefined4 local_1a0;
  Filtration_value filt;
  undefined1 local_190 [8];
  Static_vertex_vector suffix;
  Siblings *local_c0;
  Vertex_handle local_b8;
  undefined1 local_a9;
  undefined8 *local_a8;
  reference local_a0;
  undefined1 local_99;
  int v0;
  Siblings *local_90;
  Vertex_handle local_88;
  Siblings *pSStack_80;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  vi;
  Siblings *local_60;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  end;
  Simplex_vertex_range local_48;
  iterator_range<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *local_28;
  Simplex_vertex_range *vertices;
  Simplex_handle *sh_local;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this_local;
  Simplex_handle *s;
  
  sh_local = sh;
  this_local = this;
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                  *)&end.v_,in_RDX);
  simplex_vertex_range
            (&local_48,(Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)sh,
             (Simplex_handle *)&end.v_);
  local_28 = &local_48;
  SVar7 = std::
          end<boost::iterator_range<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>>
                    (&local_48);
  vi._8_8_ = SVar7.sib_;
  end.sib_._0_4_ = SVar7.v_;
  local_60 = (Siblings *)vi._8_8_;
  SVar7 = std::
          begin<boost::iterator_range<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>>
                    (local_28);
  local_90 = SVar7.sib_;
  local_88 = SVar7.v_;
  pSStack_80 = local_90;
  vi.sib_._0_4_ = local_88;
  tVar1 = boost::iterators::operator!=
                    ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                      *)&pSStack_80,
                     (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                      *)&local_60);
  local_99 = 0;
  if (!tVar1) {
    _v0 = (undefined8 *)__cxa_allocate_exception(8);
    local_99 = 1;
    *_v0 = "empty simplex";
    __cxa_throw(_v0,&char_const*::typeinfo,0);
  }
  local_a0 = boost::iterators::detail::
             iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                          *)&pSStack_80);
  boost::iterators::detail::
  iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
  ::operator++((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                *)&pSStack_80);
  tVar1 = boost::iterators::operator!=
                    ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                      *)&pSStack_80,
                     (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                      *)&local_60);
  local_a9 = 0;
  if (!tVar1) {
    local_a8 = (undefined8 *)__cxa_allocate_exception(8);
    local_a9 = 1;
    *local_a8 = "simplex of dimension 0";
    __cxa_throw(local_a8,&char_const*::typeinfo,0);
  }
  SVar7.v_ = (Vertex_handle)vi.sib_;
  SVar7.sib_ = pSStack_80;
  SVar7._12_4_ = 0;
  SVar7 = std::
          next<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>
                    (SVar7,1);
  suffix.
  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>.
  m_holder.m_size = (stored_size_type)SVar7.sib_;
  local_b8 = SVar7.v_;
  local_c0 = (Siblings *)
             suffix.
             super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
             .m_holder.m_size;
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                      *)&local_c0,
                     (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                      *)&local_60);
  if (tVar1) {
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                    *)this,in_RDX);
  }
  else {
    boost::container::static_vector<int,_40UL,_void>::static_vector
              ((static_vector<int,_40UL,_void> *)local_190);
    boost::container::
    vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>::
    push_back((vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
               *)local_190,&local_a0);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                    *)&stack0xfffffffffffffe58,in_RDX);
    pFVar3 = filtration_((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                          *)&stack0xfffffffffffffe58);
    local_1a0 = *pFVar3;
    do {
      children1._4_4_ =
           boost::iterators::detail::
           iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
           ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                        *)&pSStack_80);
      find_vertex((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&__range3,
                  (Vertex_handle)sh);
      ppVar4 = boost::container::
               vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
               ::operator->((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                             *)&__range3);
      pSVar5 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
               ::children(&ppVar4->second);
      local_1b8 = &pSVar5->members_;
      boost::container::
      vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>::
      begin((vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
             *)&__end0);
      boost::container::
      vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>::end
                ((vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                  *)local_1d8);
      while (bVar2 = boost::container::operator!=(&__end0,(vec_iterator<int_*,_false> *)local_1d8),
            bVar2) {
        piVar6 = boost::container::vec_iterator<int_*,_false>::operator*(&__end0);
        local_1dc = *piVar6;
        boost::container::
        flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>
        ::find((flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>
                *)this,(key_type *)local_1b8);
        boost::container::
        vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
        ::vec_iterator(&local_1e8,
                       (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                        *)this);
        pFVar3 = filtration_(&local_1e8);
        if ((*pFVar3 == (float)local_1a0) && (!NAN(*pFVar3) && !NAN((float)local_1a0)))
        goto LAB_001fdaa6;
        boost::container::vec_iterator<int_*,_false>::operator++(&__end0);
      }
      boost::container::
      vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>::
      push_back((vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                 *)local_190,(int *)((long)&children1 + 4));
      lhs = boost::iterators::detail::
            iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
            ::operator++((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                          *)&pSStack_80);
      tVar1 = boost::iterators::operator!=
                        ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                          *)lhs,(iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                                 *)&local_60);
    } while (tVar1);
    null_simplex();
LAB_001fdaa6:
    boost::container::static_vector<int,_40UL,_void>::~static_vector
              ((static_vector<int,_40UL,_void> *)local_190);
  }
  return (Simplex_handle)
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)this;
}

Assistant:

Simplex_handle edge_with_same_filtration(Simplex_handle sh) const {
    // See issue #251 for potential speed improvements.
    auto&& vertices = simplex_vertex_range(sh); // vertices in decreasing order
    auto end = std::end(vertices);
    auto vi = std::begin(vertices);
    GUDHI_CHECK(vi != end, "empty simplex");
    auto v0 = *vi;
    ++vi;
    GUDHI_CHECK(vi != end, "simplex of dimension 0");
    if(std::next(vi) == end) return sh; // shortcut for dimension 1
    Static_vertex_vector suffix;
    suffix.push_back(v0);
    auto filt = filtration_(sh);
    do
    {
      Vertex_handle v = *vi;
      auto&& children1 = find_vertex(v)->second.children()->members_;
      for(auto w : suffix){
        // Can we take advantage of the fact that suffix is ordered?
        Simplex_handle s = children1.find(w);
        if(filtration_(s) == filt)
          return s;
      }
      suffix.push_back(v);
    }
    while(++vi != end);
    return null_simplex();
  }